

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void test_base<unsigned_long,unsigned_long,bool(*)(unsigned_long,unsigned_long,unsigned_long*),unsigned_long(*)(unsigned_long,unsigned_long),1>
               (char *type_str,_func_bool_unsigned_long_unsigned_long_unsigned_long_ptr *fcn1,
               _func_unsigned_long_unsigned_long_unsigned_long *fcn2)

{
  bool bVar1;
  runtime_error *prVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  runtime_error *prVar4;
  string msg_1;
  safe_test<unsigned_long,_unsigned_long> st;
  bool actual;
  string msg;
  bool result;
  check_test<unsigned_long,_unsigned_long> ct;
  unsigned_long ret;
  TestCase<unsigned_long,_unsigned_long,_1> test;
  TestVector<unsigned_long,_unsigned_long,_1> tests;
  unsigned_long in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  TestVector<unsigned_long,_unsigned_long,_1> *in_stack_fffffffffffffe40;
  allocator *paVar5;
  byte local_180;
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [67];
  undefined1 local_ed;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [70];
  undefined1 local_52;
  unsigned_long local_50;
  byte local_38;
  TestVector<unsigned_long,_unsigned_long,_1> local_30 [2];
  
  TestVector<unsigned_long,_unsigned_long,_1>::TestVector(local_30);
  TestVector<unsigned_long,_unsigned_long,_1>::GetNext(in_stack_fffffffffffffe40);
  while( true ) {
    bVar1 = TestVector<unsigned_long,_unsigned_long,_1>::Done(local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_52 = check_test<unsigned_long,unsigned_long>::operator()
                         ((check_test<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffe40,
                          (_func_bool_unsigned_long_unsigned_long_unsigned_long_ptr *)
                          in_stack_fffffffffffffe38,(unsigned_long)in_stack_fffffffffffffe30,
                          in_stack_fffffffffffffe28,(unsigned_long *)0x1808b6);
    if (local_52 != (local_38 & 1)) break;
    local_50 = safe_test<unsigned_long,unsigned_long>::operator()
                         ((safe_test<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffe40,
                          (_func_unsigned_long_unsigned_long_unsigned_long *)
                          in_stack_fffffffffffffe38,(unsigned_long)in_stack_fffffffffffffe30,
                          in_stack_fffffffffffffe28);
    local_ed = 1;
    if ((local_38 & 1) != 1) {
      paVar5 = &local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Failure in ",paVar5);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              OpName::op_name(1);
      std::operator+(__lhs,in_stack_fffffffffffffe30);
      std::operator+(__lhs,in_stack_fffffffffffffe30);
      std::operator+(__lhs,in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      prVar2 = prVar4;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::runtime_error::runtime_error(prVar2,pcVar3);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TestVector<unsigned_long,_unsigned_long,_1>::GetNext(in_stack_fffffffffffffe40);
    local_38 = local_180;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Failure in ",&local_d9);
  OpName::op_name(1);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(prVar2,pcVar3);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}